

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup::IfcStructuralLoadGroup
          (IfcStructuralLoadGroup *this)

{
  IfcStructuralLoadGroup *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x188,"IfcStructuralLoadGroup");
  IfcGroup::IfcGroup((IfcGroup *)this,&PTR_construction_vtable_24__010f0090);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>,
             &PTR_construction_vtable_24__010f0140);
  *(undefined8 *)this = 0x10effb0;
  *(undefined8 *)&this->field_0x188 = 0x10f0078;
  *(undefined8 *)&this->field_0x88 = 0x10effd8;
  *(undefined8 *)&this->field_0x98 = 0x10f0000;
  *(undefined8 *)&this->field_0xd0 = 0x10f0028;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).
  _vptr_ObjectHelper = (_func_int **)0x10f0050;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup,_5UL>).
              field_0x10);
  std::__cxx11::string::string((string *)&this->ActionType);
  std::__cxx11::string::string((string *)&this->ActionSource);
  STEP::Maybe<double>::Maybe(&this->Coefficient);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Purpose);
  return;
}

Assistant:

IfcStructuralLoadGroup() : Object("IfcStructuralLoadGroup") {}